

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.c
# Opt level: O1

int oss_open(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  int *piVar5;
  int iVar6;
  
  uVar3 = al_get_system_config();
  pcVar4 = (char *)al_get_config_value(uVar3,"oss","force_ver3");
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    iVar2 = strcmp(pcVar4,"yes");
    if (iVar2 == 0) {
      cVar1 = _al_trace_prefix("oss",2,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                               ,0xf7,"oss_open");
      if (cVar1 != '\0') {
        _al_trace_suffix("Skipping OSS4 probe.\n");
      }
    }
  }
  cVar1 = _al_trace_prefix("oss",1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                           ,0x107,"oss_open");
  if (cVar1 != '\0') {
    _al_trace_suffix("OSS4 support not compiled in. Skipping OSS4 probe.\n");
  }
  uVar3 = al_get_system_config();
  pcVar4 = (char *)al_get_config_value(uVar3,"oss","device");
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    oss_audio_device_ver3 = pcVar4;
  }
  iVar2 = open(oss_audio_device_ver3,1);
  if (iVar2 != -1) {
    close(iVar2);
    strncpy(oss_audio_device,oss_audio_device_ver3,0x1ff);
    cVar1 = _al_trace_prefix("oss",1,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                             ,0xe5,"oss_open_ver3");
    if (cVar1 != '\0') {
      _al_trace_suffix("Using device: %s\n",oss_audio_device);
    }
    goto LAB_0010e18f;
  }
  piVar5 = __errno_location();
  iVar6 = *piVar5;
  if (iVar6 == 2) {
    cVar1 = _al_trace_prefix("oss",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                             ,0xd6,"oss_open_ver3");
    if (cVar1 != '\0') {
      _al_trace_suffix("No \'%s\' device available in your system.\n",oss_audio_device_ver3);
    }
    cVar1 = _al_trace_prefix("oss",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                             ,0xd8,"oss_open_ver3");
    if (cVar1 == '\0') goto LAB_0010e18f;
    pcVar4 = "Perhaps Open Sound System is not installed or running.\n";
  }
  else {
    if ((iVar6 != 0x13) && (iVar6 != 6)) {
      cVar1 = _al_trace_prefix("oss",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                               ,0xdd,"oss_open_ver3");
      if (cVar1 != '\0') {
        iVar6 = *piVar5;
        pcVar4 = strerror(iVar6);
        _al_trace_suffix("errno: %i -- %s\n",iVar6,pcVar4);
      }
      goto LAB_0010e18f;
    }
    cVar1 = _al_trace_prefix("oss",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                             ,0xd1,"oss_open_ver3");
    if (cVar1 == '\0') goto LAB_0010e18f;
    pcVar4 = "Open Sound System is not running in your system.\n";
  }
  _al_trace_suffix(pcVar4);
LAB_0010e18f:
  iVar6 = 0;
  if (iVar2 == -1) {
    cVar1 = _al_trace_prefix("oss",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                             ,0x109,"oss_open");
    iVar6 = 1;
    if (cVar1 != '\0') {
      _al_trace_suffix("Failed to init OSS.\n");
    }
  }
  return iVar6;
}

Assistant:

static int oss_open(void)
{
   bool force_oss3 = false;
   const char *force_oss3_cfg;
   force_oss3_cfg = al_get_config_value(al_get_system_config(), "oss",
      "force_ver3");
   if (force_oss3_cfg && force_oss3_cfg[0] != '\0')
      force_oss3 = strcmp(force_oss3_cfg, "yes") ? false : true;

   if (force_oss3) {
      ALLEGRO_WARN("Skipping OSS4 probe.\n");
   }

#ifdef OSS_VER_4
   bool inited = false;
   if (!force_oss3) {
      if (oss_open_ver4())
         ALLEGRO_WARN("OSS ver. 4 init failed, trying ver. 3...\n");
      else
         inited = true;
   }
   if (!inited && oss_open_ver3()) {
      ALLEGRO_ERROR("Failed to init OSS.\n");
      return 1;
   }
#else
   ALLEGRO_INFO("OSS4 support not compiled in. Skipping OSS4 probe.\n");
   if (oss_open_ver3()) {
      ALLEGRO_ERROR("Failed to init OSS.\n");
      return 1;
   }
#endif

   return 0;
}